

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

uint tonk::inplace_itoa_vitaut_1_cat(char *buf,uint32_t val)

{
  uint uVar1;
  uint32_t old;
  uint digits;
  uint t;
  uint bits;
  uint32_t val_local;
  char *buf_local;
  uint local_8;
  
  if (val == 0) {
    *buf = '0';
    local_8 = 1;
  }
  else {
    uVar1 = (uint)((0x20 - LZCOUNT(val)) * 0x4d1) >> 0xc;
    local_8 = (uVar1 + 1) - (uint)(val < *(uint *)(PowersOf10 + (ulong)uVar1 * 4));
    buf_local = buf + local_8;
    val_local = val;
    while (99 < val_local) {
      buf_local = buf_local + -2;
      *(undefined2 *)buf_local = *(undefined2 *)(str100p + (ulong)(val_local % 100) * 2);
      val_local = val_local / 100;
    }
    if (val_local < 10) {
      buf_local[-1] = (char)((ushort)*(undefined2 *)(str100p + (ulong)val_local * 2) >> 8);
    }
    else {
      *(undefined2 *)(buf_local + -2) = *(undefined2 *)(str100p + (ulong)val_local * 2);
    }
  }
  return local_8;
}

Assistant:

unsigned inplace_itoa_vitaut_1_cat(char* buf, uint32_t val)
{
    // Common case of zero
    if (val == 0) {
        buf[0] = '0';
        return 1;
    }

    const unsigned bits = NonzeroLowestBitIndex(val);
    const unsigned t = (bits + 1) * 1233 >> 12;
    const unsigned digits = t + 1 - (val < PowersOf10[t]);

    buf += digits;

    while (val >= 100)
    {
        uint32_t const old = val;

        buf -= 2;
        val /= 100;
#ifdef _MSC_VER
        *(uint16_t*)buf = str100p[old - (val * 100)];
#else
        memcpy(buf, &str100p[old - (val * 100)], sizeof(uint16_t));
#endif
    }

    if (val >= 10)
    {
        buf -= 2;
#ifdef _MSC_VER
        *(uint16_t*)buf = str100p[val];
#else
        memcpy(buf, &str100p[val], sizeof(uint16_t));
#endif
    }
    else
    {
        buf[-1] = (char)(uint8_t)(str100p[val] >> 8);
    }

    return digits;
}